

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O0

void __thiscall
jpge::jpeg_encoder::emit_dht(jpeg_encoder *this,uint8 *bits,uint8 *val,int index,bool ac_flag)

{
  int local_38;
  int local_34;
  int i_2;
  int i_1;
  int i;
  int length;
  bool ac_flag_local;
  int index_local;
  uint8 *val_local;
  uint8 *bits_local;
  jpeg_encoder *this_local;
  
  emit_marker(this,0xc4);
  i_1 = 0;
  for (i_2 = 1; i_2 < 0x11; i_2 = i_2 + 1) {
    i_1 = (uint)bits[i_2] + i_1;
  }
  emit_word(this,i_1 + 0x13);
  emit_byte(this,(char)index + ac_flag * '\x10');
  for (local_34 = 1; local_34 < 0x11; local_34 = local_34 + 1) {
    emit_byte(this,bits[local_34]);
  }
  for (local_38 = 0; local_38 < i_1; local_38 = local_38 + 1) {
    emit_byte(this,val[local_38]);
  }
  return;
}

Assistant:

void jpeg_encoder::emit_dht(uint8* bits, uint8* val, int index, bool ac_flag)
	{
		emit_marker(M_DHT);

		int length = 0;
		for (int i = 1; i <= 16; i++)
			length += bits[i];

		emit_word(length + 2 + 1 + 16);
		emit_byte(static_cast<uint8>(index + (ac_flag << 4)));

		for (int i = 1; i <= 16; i++)
			emit_byte(bits[i]);

		for (int i = 0; i < length; i++)
			emit_byte(val[i]);
	}